

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O2

void split_path_file(char **dir,char **file,char *path)

{
  char *pcVar1;
  size_t sVar2;
  char *pcVar3;
  size_t __n;
  
  pcVar1 = path;
  do {
    pcVar3 = pcVar1;
    pcVar1 = strchr(pcVar3 + 1,0x2f);
  } while (pcVar1 != (char *)0x0);
  pcVar1 = pcVar3 + 1;
  if (pcVar3 == path) {
    pcVar1 = pcVar3;
  }
  if (dir == (char **)0x0) goto LAB_00108757;
  if (path == (char *)0x0) {
LAB_00108752:
    pcVar3 = (char *)0x0;
  }
  else {
    for (sVar2 = 0;
        (__n = (long)pcVar1 - (long)path, (long)pcVar1 - (long)path != sVar2 &&
        (__n = sVar2, path[sVar2] != '\0')); sVar2 = sVar2 + 1) {
    }
    pcVar3 = (char *)malloc(__n + 1);
    if (pcVar3 == (char *)0x0) goto LAB_00108752;
    memcpy(pcVar3,path,__n);
    pcVar3[__n] = '\0';
  }
  *dir = pcVar3;
LAB_00108757:
  if (file != (char **)0x0) {
    pcVar1 = my_strdup(pcVar1);
    *file = pcVar1;
  }
  return;
}

Assistant:

void split_path_file(char ** dir, char ** file, const char * path) {
	const char * slash = path, * next;

#if defined(__WIN32)
	const char sep[] = "\\/";	// Windows allows either variant
#else
	const char sep[] = "/";
#endif

	while ((next = strpbrk(slash + 1, sep))) {
		slash = next;
	}

	if (path != slash) {
		slash++;
	}

	if (dir) {
		*dir = my_strndup(path, slash - path);
	}

	if (file) {
		*file = my_strdup(slash);
	}
}